

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::writeVertexInputValueUint
               (deUint8 *destPtr,VkFormat format,int componentNdx,deUint32 value)

{
  deUint32 dVar1;
  deUint32 *pdVar2;
  deUint8 *destFormatPtr;
  deUint32 componentSize;
  deUint32 value_local;
  int componentNdx_local;
  VkFormat format_local;
  deUint8 *destPtr_local;
  
  dVar1 = getVertexFormatComponentSize(format);
  pdVar2 = (deUint32 *)(destPtr + dVar1 * componentNdx);
  if (dVar1 == 1) {
    *(char *)pdVar2 = (char)value;
  }
  else if (dVar1 == 2) {
    *(short *)pdVar2 = (short)value;
  }
  else if (dVar1 == 4) {
    *pdVar2 = value;
  }
  return;
}

Assistant:

void writeVertexInputValueUint (deUint8* destPtr, VkFormat format, int componentNdx, deUint32 value)
{
	const deUint32	componentSize	= getVertexFormatComponentSize(format);
	deUint8*		destFormatPtr	= ((deUint8*)destPtr) + componentSize * componentNdx;

	switch (componentSize)
	{
		case 1:
			*((deUint8 *)destFormatPtr) = (deUint8)value;
			break;

		case 2:
			*((deUint16 *)destFormatPtr) = (deUint16)value;
			break;

		case 4:
			*((deUint32 *)destFormatPtr) = (deUint32)value;
			break;

		default:
			DE_ASSERT(false);
	}
}